

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuHeapD.c
# Opt level: O0

void Fxu_HeapDoubleMoveUp(Fxu_HeapDouble *p,Fxu_Double *pDiv)

{
  Fxu_Double **pDiv2;
  Fxu_Double **ppPar;
  Fxu_Double **ppDiv;
  Fxu_Double *pDiv_local;
  Fxu_HeapDouble *p_local;
  
  ppPar = p->pTree + pDiv->HNum;
  while ((1 < (*ppPar)->HNum &&
         (pDiv2 = p->pTree + ((*ppPar)->HNum >> 1), (*pDiv2)->Weight < (*ppPar)->Weight))) {
    Fxu_HeapDoubleSwap(ppPar,pDiv2);
    ppPar = pDiv2;
  }
  return;
}

Assistant:

void Fxu_HeapDoubleMoveUp( Fxu_HeapDouble * p, Fxu_Double * pDiv )
{
	Fxu_Double ** ppDiv, ** ppPar;
	ppDiv = &FXU_HEAP_DOUBLE_CURRENT(p, pDiv);
	while ( FXU_HEAP_DOUBLE_PARENT_EXISTS(p,*ppDiv) )
	{
		ppPar = &FXU_HEAP_DOUBLE_PARENT(p,*ppDiv);
		if ( FXU_HEAP_DOUBLE_WEIGHT(*ppDiv) > FXU_HEAP_DOUBLE_WEIGHT(*ppPar) )
		{
			Fxu_HeapDoubleSwap( ppDiv, ppPar );
			ppDiv = ppPar;
		}
		else
			break;
	}
}